

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

bool kj::anon_unknown_0::systemSupportsAddress(StringPtr addr,StringPtr service)

{
  bool bVar1;
  int iVar2;
  char *__name;
  char *local_80;
  addrinfo *paStack_68;
  int status;
  addrinfo *list;
  addrinfo hints;
  StringPtr service_local;
  StringPtr addr_local;
  
  service_local.content.size_ = (size_t)addr.content.ptr;
  service_local.content.ptr = (char *)service.content.size_;
  hints.ai_next = (addrinfo *)service.content.ptr;
  list._4_4_ = 0;
  hints.ai_flags = 0;
  list._0_4_ = 0x28;
  hints.ai_family = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_canonname = (char *)0x0;
  __name = StringPtr::cStr((StringPtr *)&service_local.content.size_);
  bVar1 = StringPtr::operator==((StringPtr *)&hints.ai_next,(void *)0x0);
  if (bVar1) {
    local_80 = (char *)0x0;
  }
  else {
    local_80 = StringPtr::cStr((StringPtr *)&hints.ai_next);
  }
  iVar2 = getaddrinfo(__name,local_80,(addrinfo *)&list,&stack0xffffffffffffff98);
  if (iVar2 == 0) {
    freeaddrinfo(paStack_68);
  }
  return iVar2 == 0;
}

Assistant:

bool systemSupportsAddress(StringPtr addr, StringPtr service = nullptr) {
  // Can getaddrinfo() parse this addresses? This is only true if the address family (e.g., ipv6)
  // is configured on at least one interface. (The loopback interface usually has both ipv4 and
  // ipv6 configured, but not always.)
  struct addrinfo hints;
  hints.ai_family = AF_UNSPEC;
  hints.ai_socktype = 0;
#if !defined(AI_V4MAPPED)
  hints.ai_flags = AI_ADDRCONFIG;
#else
  hints.ai_flags = AI_V4MAPPED | AI_ADDRCONFIG;
#endif
  hints.ai_protocol = 0;
  hints.ai_canonname = nullptr;
  hints.ai_addr = nullptr;
  hints.ai_next = nullptr;
  struct addrinfo* list;
  int status = getaddrinfo(
      addr.cStr(), service == nullptr ? nullptr : service.cStr(), &hints, &list);
  if (status == 0) {
    freeaddrinfo(list);
    return true;
  } else {
    return false;
  }
}